

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O2

string * __thiscall
QPDFFileSpecObjectHelper::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFileSpecObjectHelper *this)

{
  bool bVar1;
  QPDFObjectHandle desc;
  allocator<char> local_51;
  QPDFObjectHandle local_50;
  undefined1 local_40 [16];
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_40,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_QPDFObjectHelper).super_BaseHandle);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_40 + 0x10),"/Desc",&local_51);
  QPDFObjectHandle::getKey(&local_50,(string *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  bVar1 = QPDFObjectHandle::isString(&local_50);
  if (bVar1) {
    QPDFObjectHandle::getUTF8Value_abi_cxx11_((string *)(local_40 + 0x10),&local_50);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_40 + 0x10));
    std::__cxx11::string::~string((string *)(local_40 + 0x10));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFileSpecObjectHelper::getDescription()
{
    std::string result;
    auto desc = oh().getKey("/Desc");
    if (desc.isString()) {
        result = desc.getUTF8Value();
    }
    return result;
}